

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

char * Json::duplicateAndPrefixStringValue(char *value,uint length)

{
  allocator local_1f1;
  String local_1f0;
  uint *local_1d0;
  char *newString;
  size_t actualLength;
  ostringstream local_190 [8];
  OStringStream oss;
  uint length_local;
  char *value_local;
  
  if (0x7ffffffa < length) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::operator<<((ostream *)local_190,
                    "in Json::Value::duplicateAndPrefixStringValue(): length too big for prefixing")
    ;
    std::__cxx11::ostringstream::str();
    throwLogicError((String *)&actualLength);
  }
  newString = (char *)((ulong)length + 5);
  local_1d0 = (uint *)malloc((size_t)newString);
  if (local_1d0 == (uint *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_1f0,
               "in Json::Value::duplicateAndPrefixStringValue(): Failed to allocate string value buffer"
               ,&local_1f1);
    throwRuntimeError(&local_1f0);
  }
  *local_1d0 = length;
  memcpy(local_1d0 + 1,value,(ulong)length);
  *(char *)((long)local_1d0 + (long)(newString + -1)) = '\0';
  return (char *)local_1d0;
}

Assistant:

static inline char* duplicateAndPrefixStringValue(const char* value,
                                                  unsigned int length) {
  // Avoid an integer overflow in the call to malloc below by limiting length
  // to a sane value.
  JSON_ASSERT_MESSAGE(length <= static_cast<unsigned>(Value::maxInt) -
                                    sizeof(unsigned) - 1U,
                      "in Json::Value::duplicateAndPrefixStringValue(): "
                      "length too big for prefixing");
  size_t actualLength = sizeof(length) + length + 1;
  auto newString = static_cast<char*>(malloc(actualLength));
  if (newString == nullptr) {
    throwRuntimeError("in Json::Value::duplicateAndPrefixStringValue(): "
                      "Failed to allocate string value buffer");
  }
  *reinterpret_cast<unsigned*>(newString) = length;
  memcpy(newString + sizeof(unsigned), value, length);
  newString[actualLength - 1U] =
      0; // to avoid buffer over-run accidents by users later
  return newString;
}